

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O0

istream * operator>>(istream *in,SequenceD<64> *t_seq)

{
  Sequence *pSVar1;
  Sequence local_d8;
  Sequence local_70;
  SequenceD<64> *local_18;
  SequenceD<64> *t_seq_local;
  istream *in_local;
  
  local_18 = t_seq;
  t_seq_local = (SequenceD<64> *)in;
  read_seq_from_chars(&local_70,in,4);
  pSVar1 = SequenceD<64>::left(local_18);
  Sequence::operator=(pSVar1,&local_70);
  Sequence::~Sequence(&local_70);
  read_seq_from_chars(&local_d8,(istream *)t_seq_local,4);
  pSVar1 = SequenceD<64>::right(local_18);
  Sequence::operator=(pSVar1,&local_d8);
  Sequence::~Sequence(&local_d8);
  return (istream *)t_seq_local;
}

Assistant:

std::istream &operator>>(std::istream &in, SequenceD<64> &t_seq) {
    t_seq.left() = read_seq_from_chars(in, 4);
    t_seq.right() = read_seq_from_chars(in, 4);
    return in;
}